

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::Context::applyCommandLine(Context *this,int argc,char **argv)

{
  String *pSVar1;
  char *pcVar2;
  ContextState *pCVar3;
  size_t sVar4;
  anon_union_24_2_13149d16_for_String_2 local_30;
  
  parseArgs(this,argc,argv,false);
  if (argc != 0) {
    pcVar2 = *argv;
    sVar4 = strlen(pcVar2);
    String::String((String *)&local_30.data,pcVar2,(uint)sVar4);
    pCVar3 = this->p;
    pSVar1 = &(pCVar3->super_ContextOptions).binary_name;
    if (((pCVar3->super_ContextOptions).binary_name.field_0.buf[0x17] < '\0') &&
       (pcVar2 = (pSVar1->field_0).data.ptr, pcVar2 != (char *)0x0)) {
      operator_delete__(pcVar2);
    }
    *(undefined8 *)((long)&(pCVar3->super_ContextOptions).binary_name.field_0 + 0x10) =
         local_30._16_8_;
    (pSVar1->field_0).data.ptr = local_30.data.ptr;
    *(undefined8 *)((long)&(pCVar3->super_ContextOptions).binary_name.field_0 + 8) = local_30._8_8_;
  }
  return;
}

Assistant:

void Context::applyCommandLine(int argc, const char* const* argv) {
    parseArgs(argc, argv);
    if(argc)
        p->binary_name = argv[0];
}